

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.h
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::setTolerances
          (SLUFactor<double> *this,shared_ptr<soplex::Tolerances> *tolerances)

{
  shared_ptr<soplex::Tolerances> *newTolerances;
  SSVectorBase<double> *this_00;
  long in_RDI;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff98;
  SSVectorBase<double> *in_stack_ffffffffffffffa0;
  
  std::shared_ptr<soplex::Tolerances>::operator=
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  newTolerances = (shared_ptr<soplex::Tolerances> *)(in_RDI + 0x2d0);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffffa0,newTolerances);
  SSVectorBase<double>::setTolerances(in_stack_ffffffffffffffa0,newTolerances);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1ff6d3);
  this_00 = (SSVectorBase<double> *)(in_RDI + 800);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)this_00,newTolerances);
  SSVectorBase<double>::setTolerances(this_00,newTolerances);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1ff70b);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)this_00,newTolerances);
  SSVectorBase<double>::setTolerances(this_00,newTolerances);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1ff743);
  return;
}

Assistant:

virtual void setTolerances(std::shared_ptr<Tolerances> tolerances)
   {
      this->_tolerances = tolerances;
      this->eta.setTolerances(tolerances);
      this->forest.setTolerances(tolerances);
      this->ssvec.setTolerances(tolerances);
   }